

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O3

void __thiscall Encoder::SaveLazyBailOutJitTransferData(Encoder *this)

{
  Func *pFVar1;
  Type piVar2;
  Type pSVar3;
  code *pcVar4;
  bool bVar5;
  BOOL BVar6;
  undefined4 *puVar7;
  StackSym *pSVar8;
  InProcNativeEntryPointData *this_00;
  HeapAllocator *this_01;
  Type __s;
  JitTransferData *pJVar9;
  ulong uVar10;
  Type piVar11;
  uint uVar12;
  int iVar13;
  int count;
  uint uVar15;
  size_t byteSize;
  undefined1 local_58 [8];
  TrackAllocData data;
  long lVar14;
  
  bVar5 = Func::HasLazyBailOut(this->m_func);
  if (bVar5) {
    if ((this->m_sortedLazyBailoutRecordList->
        super_ReadOnlyList<LazyBailOutRecord,_Memory::ArenaAllocator,_DefaultComparer>).count < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                         ,0x69c,"(this->m_sortedLazyBailoutRecordList->Count() > 0)",
                         "this->m_sortedLazyBailoutRecordList->Count() > 0");
      if (!bVar5) goto LAB_0040a699;
      *puVar7 = 0;
    }
    if (this->m_lazyBailOutThunkOffset == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                         ,0x69d,"(this->m_lazyBailOutThunkOffset != 0)",
                         "this->m_lazyBailOutThunkOffset != 0");
      if (!bVar5) goto LAB_0040a699;
      *puVar7 = 0;
    }
    pSVar8 = Func::GetLazyBailOutRecordSlot(this->m_func);
    if (pSVar8 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Encoder.cpp"
                         ,0x69e,"(this->m_func->GetLazyBailOutRecordSlot() != nullptr)",
                         "this->m_func->GetLazyBailOutRecordSlot() != nullptr");
      if (!bVar5) goto LAB_0040a699;
      *puVar7 = 0;
    }
    this_00 = Js::EntryPointInfo::GetInProcNativeEntryPointData(this->m_func->m_entryPointInfo);
    InProcNativeEntryPointData::SetSortedLazyBailOutRecordList
              (this_00,this->m_sortedLazyBailoutRecordList);
    pSVar8 = Func::GetLazyBailOutRecordSlot(this->m_func);
    InProcNativeEntryPointData::SetLazyBailOutRecordSlotOffset(this_00,pSVar8->m_offset);
    InProcNativeEntryPointData::SetLazyBailOutThunkOffset(this_00,this->m_lazyBailOutThunkOffset);
  }
  uVar15 = (this->m_func->lazyBailoutProperties).
           super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           .count - (this->m_func->lazyBailoutProperties).
                    super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                    .freeCount;
  if (0 < (int)uVar15) {
    local_58 = (undefined1  [8])&int::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_b63526;
    data.filename._0_4_ = 0x6a9;
    data.plusSize = (ulong)uVar15;
    this_01 = Memory::HeapAllocator::TrackAllocInfo
                        (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_58);
    BVar6 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar6 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar5) goto LAB_0040a699;
      *puVar7 = 0;
    }
    byteSize = (ulong)uVar15 << 2;
    __s = (Type)Memory::HeapAllocator::AllocT<false>(this_01,byteSize);
    memset(__s,0,byteSize);
    if (__s == (Type)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar5) {
LAB_0040a699:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
    }
    pFVar1 = this->m_func;
    uVar12 = (pFVar1->lazyBailoutProperties).
             super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             .bucketCount;
    if (uVar12 != 0) {
      piVar2 = (pFVar1->lazyBailoutProperties).
               super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               .buckets;
      uVar10 = 0;
      piVar11 = __s;
      do {
        iVar13 = piVar2[uVar10];
        if (iVar13 != -1) {
          pSVar3 = (pFVar1->lazyBailoutProperties).
                   super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   .entries;
          do {
            lVar14 = (long)iVar13;
            iVar13 = pSVar3[iVar13].
                     super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                     .super_ImplicitKeyValueEntry<int,_int>.
                     super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
                     super_ValueEntryData<int>.next;
            *piVar11 = pSVar3[lVar14].
                       super_DefaultHashedEntry<int,_int,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
                       .super_ImplicitKeyValueEntry<int,_int>.
                       super_ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>.
                       super_ValueEntryData<int>.value;
            piVar11 = piVar11 + 1;
          } while (iVar13 != -1);
          uVar12 = (pFVar1->lazyBailoutProperties).
                   super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                   .bucketCount;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar12);
    }
    pJVar9 = Js::EntryPointInfo::GetJitTransferData(pFVar1->m_entryPointInfo);
    pJVar9->lazyBailoutProperties = __s;
    pJVar9->lazyBailoutPropertyCount = uVar15;
  }
  return;
}

Assistant:

void
Encoder::SaveLazyBailOutJitTransferData()
{
    if (this->m_func->HasLazyBailOut())
    {
        Assert(this->m_sortedLazyBailoutRecordList->Count() > 0);
        Assert(this->m_lazyBailOutThunkOffset != 0);
        Assert(this->m_func->GetLazyBailOutRecordSlot() != nullptr);

        auto nativeEntryPointData = this->m_func->GetInProcJITEntryPointInfo()->GetInProcNativeEntryPointData();
        nativeEntryPointData->SetSortedLazyBailOutRecordList(this->m_sortedLazyBailoutRecordList);
        nativeEntryPointData->SetLazyBailOutRecordSlotOffset(this->m_func->GetLazyBailOutRecordSlot()->m_offset);
        nativeEntryPointData->SetLazyBailOutThunkOffset(this->m_lazyBailOutThunkOffset);
    }

    if (this->m_func->lazyBailoutProperties.Count() > 0)
    {
        const int count = this->m_func->lazyBailoutProperties.Count();
        Js::PropertyId* lazyBailoutProperties = HeapNewArrayZ(Js::PropertyId, count);
        Js::PropertyId* dstProperties = lazyBailoutProperties;
        this->m_func->lazyBailoutProperties.Map([&](Js::PropertyId propertyId)
        {
            *dstProperties++ = propertyId;
        });
        this->m_func->GetInProcJITEntryPointInfo()->GetJitTransferData()->SetLazyBailoutProperties(lazyBailoutProperties, count);
    }
}